

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O0

int ya_getopt_shortopts(int argc,char **argv,char *optstring,int long_only)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  char *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  char *os;
  int opt;
  uint local_4;
  
  local_4 = (uint)*ya_optnext;
  pcVar2 = strchr(in_RDX,local_4);
  if (pcVar2 == (char *)0x0) {
    ya_optarg = (char *)0x0;
    if (in_ECX == 0) {
      ya_optopt = local_4;
      ya_getopt_error(in_RDX,"%s: invalid option -- \'%c\'\n",*in_RSI,(ulong)local_4);
      pcVar2 = ya_optnext + 1;
      ya_optnext = ya_optnext + 1;
      if (*pcVar2 == '\0') {
        ya_optind = ya_optind + 1;
        ya_optnext = (char *)0x0;
      }
    }
    else {
      ya_getopt_error(in_RDX,"%s: unrecognized option \'-%s\'\n",*in_RSI,ya_optnext);
      ya_optind = ya_optind + 1;
      ya_optnext = (char *)0x0;
    }
    local_4 = 0x3f;
  }
  else if (pcVar2[1] == ':') {
    if (ya_optnext[1] == '\0') {
      iVar1 = ya_optind + 1;
      ya_optnext = (char *)0x0;
      if (pcVar2[2] == ':') {
        ya_optarg = (char *)0x0;
        ya_optind = iVar1;
      }
      else {
        if (iVar1 == in_EDI) {
          ya_optarg = (char *)0x0;
          ya_optind = iVar1;
          ya_optopt = local_4;
          ya_getopt_error(in_RDX,"%s: option requires an argument -- \'%c\'\n",*in_RSI,
                          (ulong)local_4);
          if (*in_RDX == ':') {
            return 0x3a;
          }
          return 0x3f;
        }
        ya_optarg = (char *)in_RSI[iVar1];
        ya_optind = ya_optind + 2;
      }
    }
    else {
      ya_optarg = ya_optnext + 1;
      ya_optind = ya_optind + 1;
    }
    ya_optnext = (char *)0x0;
  }
  else {
    ya_optarg = (char *)0x0;
    if (ya_optnext[1] == '\0') {
      ya_optnext = (char *)0x0;
      ya_optind = ya_optind + 1;
    }
    else {
      ya_optnext = ya_optnext + 1;
    }
  }
  return local_4;
}

Assistant:

static int ya_getopt_shortopts(int argc, char * const argv[], const char *optstring, int long_only)
{
    int opt = *ya_optnext;
    const char *os = strchr(optstring, opt);

    if (os == NULL) {
        ya_optarg = NULL;
        if (long_only) {
            ya_getopt_error(optstring, "%s: unrecognized option '-%s'\n", argv[0], ya_optnext);
            ya_optind++;
            ya_optnext = NULL;
        } else {
            ya_optopt = opt;
            ya_getopt_error(optstring, "%s: invalid option -- '%c'\n", argv[0], opt);
            if (*(++ya_optnext) == 0) {
                ya_optind++;
                ya_optnext = NULL;
            }
        }
        return '?';
    }
    if (os[1] == ':') {
        if (ya_optnext[1] == 0) {
            ya_optind++;
            ya_optnext = NULL;
            if (os[2] == ':') {
                /* optional argument */
                ya_optarg = NULL;
            } else {
                if (ya_optind == argc) {
                    ya_optarg = NULL;
                    ya_optopt = opt;
                    ya_getopt_error(optstring, "%s: option requires an argument -- '%c'\n", argv[0], opt);
                    if (optstring[0] == ':') {
                        return ':';
                    } else {
                        return '?';
                    }
                }
                ya_optarg = argv[ya_optind];
                ya_optind++;
            }
        } else {
            ya_optarg = ya_optnext + 1;
            ya_optind++;
        }
        ya_optnext = NULL;
    } else {
        ya_optarg = NULL;
        if (ya_optnext[1] == 0) {
            ya_optnext = NULL;
            ya_optind++;
        } else {
            ya_optnext++;
        }
    }
    return opt;
}